

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  ulong uVar1;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar2;
  cmListFileBacktrace local_60;
  undefined1 local_50 [8];
  cmGeneratorExpression ge;
  allocator<char> local_21;
  string *local_20;
  string *depfile;
  cmCustomCommandGenerator *this_local;
  
  depfile = (string *)this;
  this_local = (cmCustomCommandGenerator *)__return_storage_ptr__;
  local_20 = cmCustomCommand::GetDepfile_abi_cxx11_(this->CC);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cmakeInstance = cmLocalGenerator::GetCMakeInstance(this->LG);
    pcVar2 = cmCustomCommand::GetBacktrace(this->CC);
    cmListFileBacktrace::cmListFileBacktrace(&local_60,pcVar2);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_50,cmakeInstance,&local_60);
    cmListFileBacktrace::~cmListFileBacktrace(&local_60);
    anon_unknown.dwarf_104ada4::EvaluateDepfile
              (__return_storage_ptr__,local_20,(cmGeneratorExpression *)local_50,this->LG,
               &this->OutputConfig);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_50);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetDepfile() const
{
  const auto& depfile = this->CC->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  cmGeneratorExpression ge(*this->LG->GetCMakeInstance(),
                           this->CC->GetBacktrace());
  return EvaluateDepfile(depfile, ge, this->LG, this->OutputConfig);
}